

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

Node * __thiscall Fl_Preferences::Node::search(Node *this,char *path,int offset)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  Node *pNVar4;
  char *pcVar5;
  Node *pNVar6;
  
  while( true ) {
    if (offset != 0) {
      pcVar5 = this->path_;
      goto LAB_001c4866;
    }
    if (*path != '.') break;
    pNVar6 = this;
    if (path[1] != '/') {
      if (path[1] == '\0') {
        return this;
      }
      break;
    }
    do {
      this = pNVar6;
      if ((this->field_0x30 & 2) != 0) break;
      pNVar6 = (this->field_2).parent_;
    } while ((this->field_2).parent_ != (Node *)0x0);
    pcVar5 = path + 2;
    path = path + 2;
    offset = 2;
    if (*pcVar5 == '\0') {
      return this;
    }
  }
  pcVar5 = this->path_;
  sVar3 = strlen(pcVar5);
  offset = (int)sVar3 + 1;
LAB_001c4866:
  sVar3 = strlen(pcVar5);
  iVar2 = (int)sVar3;
  if (iVar2 < offset + -1) {
    return (Node *)0x0;
  }
  uVar1 = iVar2 - offset;
  if (uVar1 != 0 && offset <= iVar2) {
    iVar2 = strncmp(path,pcVar5 + offset,(ulong)uVar1);
    if (iVar2 != 0) {
      return (Node *)0x0;
    }
    if (path[uVar1] == '\0') {
      return this;
    }
    if (path[uVar1] != '/') {
      return (Node *)0x0;
    }
  }
  pNVar6 = this->child_;
  if (pNVar6 == (Node *)0x0) {
    return (Node *)0x0;
  }
  do {
    pNVar4 = search(pNVar6,path,offset);
    if (pNVar4 != (Node *)0x0) {
      return pNVar4;
    }
    pNVar6 = pNVar6->next_;
  } while (pNVar6 != (Node *)0x0);
  return (Node *)0x0;
}

Assistant:

Fl_Preferences::Node *Fl_Preferences::Node::search( const char *path, int offset ) { 
  if ( offset == 0 ) {
    if ( path[0] == '.' ) {
      if ( path[1] == 0 ) {
	return this; // user was searching for current node
      } else if ( path[1] == '/' ) {
	Node *nn = this;
	while ( nn->parent() ) nn = nn->parent();
	if ( path[2]==0 ) {		// user is searching for root ( "./" )
	  return nn;
	}
	return nn->search( path+2, 2 ); // do a relative search on the root node
      }
    }
    offset = (int) strlen( path_ ) + 1;
  }
  int len = (int) strlen( path_ );
  if ( len < offset-1 ) return 0;
  len -= offset;
  if ( ( len <= 0 ) || ( strncmp( path, path_+offset, len ) == 0 ) ) {
    if ( len > 0 && path[ len ] == 0 )
      return this;
    if ( len <= 0 || path[ len ] == '/' ) {
      for ( Node *nd = child_; nd; nd = nd->next_ ) {
	Node *nn = nd->search( path, offset );
	if ( nn ) return nn;
      }
      return 0;
    }
  }
  return 0;
}